

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

StructUnionTypeSyntax * __thiscall
slang::parsing::Parser::parseStructUnion(Parser *this,SyntaxKind syntaxKind)

{
  Token semi_00;
  Token packed;
  Token signing_00;
  Token openBrace_00;
  Token TVar1;
  ulong uVar2;
  SourceLocation SVar3;
  DataTypeSyntax *type;
  SourceLocation SVar4;
  undefined4 extraout_var;
  StructUnionTypeSyntax *pSVar5;
  Info *pIVar6;
  size_type sVar7;
  EVP_PKEY_CTX *pEVar8;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *src;
  size_type extraout_RDX_02;
  DiagCode code;
  Token TVar9;
  Token TVar10;
  span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL> sVar11;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> sVar12;
  SourceRange SVar13;
  Token keyword;
  Token tagged;
  Token openBrace;
  Token signing;
  Token semi;
  SmallVector<slang::syntax::StructUnionMemberSyntax_*,_5UL> buffer;
  TokenKind local_1b8;
  Token local_1a8;
  SyntaxKind local_194;
  Token local_190;
  Token local_180;
  ulong local_170;
  Token local_168;
  Token local_158;
  Token local_148;
  Info *local_138;
  undefined8 local_130;
  SyntaxFactory *local_128;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_120;
  StructUnionMemberSyntax *local_f0;
  undefined8 local_e8;
  Info *pIStack_e0;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> local_d8;
  Token local_a8;
  Token local_98;
  Token local_80;
  SmallVectorBase<slang::syntax::StructUnionMemberSyntax_*> local_70 [2];
  
  local_194 = syntaxKind;
  TVar9 = ParserBase::consume(&this->super_ParserBase);
  local_138 = TVar9.info;
  uVar2 = TVar9._0_8_;
  local_180 = ParserBase::consumeIf(&this->super_ParserBase,TaggedKeyword);
  TVar10 = ParserBase::consumeIf(&this->super_ParserBase,PackedKeyword);
  pIVar6 = TVar10.info;
  local_130 = TVar10._0_8_;
  local_148 = parseSigning(this);
  local_158 = ParserBase::expect(&this->super_ParserBase,OpenBrace);
  Token::Token(&local_1a8);
  local_70[0].data_ = (pointer)local_70[0].firstElement;
  local_70[0].len = 0;
  local_70[0].cap = 5;
  if (((undefined1  [16])local_158 & (undefined1  [16])0x10000) == (undefined1  [16])0x0) {
    local_168 = ParserBase::peek(&this->super_ParserBase);
    local_170 = uVar2 & 0xffff;
    local_128 = &this->factory;
    while ((local_168.kind != EndOfFile && (local_168.kind != CloseBrace))) {
      sVar11 = (span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL>)
               parseAttributes(this);
      Token::Token(&local_190);
      TVar10 = ParserBase::peek(&this->super_ParserBase);
      if ((TVar10._0_4_ & 0xfffe) == 0xfa) {
        local_190 = ParserBase::consume(&this->super_ParserBase);
        if (pIVar6 == (Info *)0x0) {
          if ((int)local_170 != 0x13b) goto LAB_00317eb0;
          SVar13 = Token::range(&local_190);
          code.subsystem = Parser;
          code.code = 0x82;
        }
        else {
          SVar13 = Token::range(&local_190);
          code.subsystem = Parser;
          code.code = 0x81;
        }
        ParserBase::addDiag(&this->super_ParserBase,code,SVar13);
      }
LAB_00317eb0:
      type = parseDataType(this,(bitmask<slang::parsing::detail::TypeOptions>)
                                ((uint)(local_180.info != (Info *)0x0 && local_170 == 0x13b) * 2));
      Token::Token(&local_80);
      local_d8.elements =
           parseDeclarators<&slang::syntax::SyntaxFacts::isNotIdOrComma>
                     (this,Semicolon,&local_80,false,false);
      sVar7 = local_d8.elements.size_;
      local_120.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
      local_120.super_SyntaxListBase._0_16_ = ZEXT816(0x4ea348);
      local_d8.super_SyntaxListBase.super_SyntaxNode.kind = SeparatedList;
      local_d8.super_SyntaxListBase._0_16_ = ZEXT816(0x4ed380);
      semi_00.info = local_80.info;
      semi_00.kind = local_80.kind;
      semi_00._2_1_ = local_80._2_1_;
      semi_00.numFlags.raw = local_80.numFlags.raw;
      semi_00.rawLen = local_80.rawLen;
      local_120.super_SyntaxListBase.childCount = sVar11.size_;
      local_120.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> =
           (span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)sVar11;
      local_d8.super_SyntaxListBase.childCount = sVar7;
      local_f0 = slang::syntax::SyntaxFactory::structUnionMember
                           (local_128,&local_120,local_190,type,&local_d8,semi_00);
      SmallVectorBase<slang::syntax::StructUnionMemberSyntax*>::
      emplace_back<slang::syntax::StructUnionMemberSyntax*>
                ((SmallVectorBase<slang::syntax::StructUnionMemberSyntax*> *)local_70,&local_f0);
      if (sVar7 == 0 && (type->super_ExpressionSyntax).super_SyntaxNode.kind == ImplicitType) {
        local_120.super_SyntaxListBase._0_16_ = ParserBase::peek(&this->super_ParserBase);
        SVar3 = Token::location((Token *)&local_120);
        SVar4 = Token::location(&local_168);
        if (SVar3 == SVar4) {
          ParserBase::skipToken(&this->super_ParserBase,(optional<slang::DiagCode>)0x0);
        }
      }
      local_168 = ParserBase::peek(&this->super_ParserBase);
    }
    local_1a8 = ParserBase::expect(&this->super_ParserBase,CloseBrace);
    if ((local_70[0].len == 0) &&
       (((undefined1  [16])local_1a8 & (undefined1  [16])0x10000) == (undefined1  [16])0x0)) {
      SVar3 = Token::location(&local_1a8);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x350005,SVar3);
    }
  }
  else {
    SVar3 = Token::location(&local_158);
    local_1a8 = ParserBase::missingToken(&this->super_ParserBase,CloseBrace,SVar3);
  }
  sVar12 = (span<slang::syntax::TokenOrSyntax,_18446744073709551615UL>)parseDimensionList(this);
  pEVar8 = (EVP_PKEY_CTX *)sVar12.size_;
  src = pEVar8;
  if (pIVar6 == (Info *)0x0) {
    if (pEVar8 != (EVP_PKEY_CTX *)0x0) {
      local_120.super_SyntaxListBase._0_16_ =
           slang::syntax::SyntaxNode::getFirstToken
                     (&(*(VariableDimensionSyntax **)
                         &((sVar12.data_)->super_ConstTokenOrSyntax).
                          super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                          super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                          .
                          super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                          .
                          super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                          .
                          super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                          .
                          super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                       )->super_SyntaxNode);
      SVar3 = Token::location((Token *)&local_120);
      local_d8.super_SyntaxListBase._0_16_ =
           slang::syntax::SyntaxNode::getLastToken
                     (*(SyntaxNode **)((long)sVar12.data_ + (long)pEVar8 * 8 + -8));
      SVar13 = Token::range((Token *)&local_d8);
      SVar13.endLoc = SVar13.endLoc;
      SVar13.startLoc = SVar3;
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x780005,SVar13);
      src = extraout_RDX;
    }
    if (local_148.info != (Info *)0x0) {
      SVar13 = Token::range(&local_148);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x8d0005,SVar13);
      src = extraout_RDX_00;
    }
  }
  local_1b8 = TVar9.kind;
  if ((local_1b8 == StructKeyword) && (local_180.info != (Info *)0x0)) {
    SVar13 = Token::range(&local_180);
    ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x870005,SVar13);
    src = extraout_RDX_01;
  }
  TVar1 = local_148;
  TVar10 = local_158;
  TVar9 = local_180;
  local_e8 = local_130;
  local_98.kind = local_148.kind;
  local_98._2_1_ = local_148._2_1_;
  local_98.numFlags.raw = local_148.numFlags.raw;
  local_98.rawLen = local_148.rawLen;
  local_98.info = local_148.info;
  local_a8.kind = local_158.kind;
  local_a8._2_1_ = local_158._2_1_;
  local_a8.numFlags.raw = local_158.numFlags.raw;
  local_a8.rawLen = local_158.rawLen;
  local_a8.info = local_158.info;
  local_158 = TVar10;
  local_148 = TVar1;
  pIStack_e0 = pIVar6;
  local_120.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_._0_4_
       = SmallVectorBase<slang::syntax::StructUnionMemberSyntax_*>::copy
                   (local_70,(EVP_PKEY_CTX *)(this->super_ParserBase).alloc,src);
  local_120.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_._4_4_
       = extraout_var;
  local_120.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
  local_120.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ =
       extraout_RDX_02;
  local_120.super_SyntaxListBase._0_16_ = ZEXT816(0x4edd50);
  local_d8.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
  local_d8.super_SyntaxListBase._0_16_ = ZEXT816(0x4ea278);
  packed.info = pIStack_e0;
  packed.kind = (undefined2)local_e8;
  packed._2_1_ = local_e8._2_1_;
  packed.numFlags.raw = local_e8._3_1_;
  packed.rawLen = local_e8._4_4_;
  signing_00.info = local_98.info;
  signing_00.kind = local_98.kind;
  signing_00._2_1_ = local_98._2_1_;
  signing_00.numFlags.raw = local_98.numFlags.raw;
  signing_00.rawLen = local_98.rawLen;
  openBrace_00.info = local_a8.info;
  openBrace_00.kind = local_a8.kind;
  openBrace_00._2_1_ = local_a8._2_1_;
  openBrace_00.numFlags.raw = local_a8.numFlags.raw;
  openBrace_00.rawLen = local_a8.rawLen;
  keyword.info = local_138;
  keyword.kind = (short)uVar2;
  keyword._2_1_ = (char)(uVar2 >> 0x10);
  keyword.numFlags.raw = (char)(uVar2 >> 0x18);
  keyword.rawLen = (int)(uVar2 >> 0x20);
  local_d8.super_SyntaxListBase.childCount = (size_t)pEVar8;
  local_d8.elements = sVar12;
  pSVar5 = slang::syntax::SyntaxFactory::structUnionType
                     (&this->factory,local_194,keyword,TVar9,packed,signing_00,openBrace_00,
                      (SyntaxList<slang::syntax::StructUnionMemberSyntax> *)&local_120,local_1a8,
                      (SyntaxList<slang::syntax::VariableDimensionSyntax> *)&local_d8);
  if (local_70[0].data_ != (pointer)local_70[0].firstElement) {
    free(local_70[0].data_);
  }
  return pSVar5;
}

Assistant:

StructUnionTypeSyntax& Parser::parseStructUnion(SyntaxKind syntaxKind) {
    auto keyword = consume();
    auto tagged = consumeIf(TokenKind::TaggedKeyword);
    auto packed = consumeIf(TokenKind::PackedKeyword);
    auto signing = parseSigning();
    auto openBrace = expect(TokenKind::OpenBrace);

    Token closeBrace;
    SmallVector<StructUnionMemberSyntax*> buffer;

    if (openBrace.isMissing())
        closeBrace = missingToken(TokenKind::CloseBrace, openBrace.location());
    else {
        auto curr = peek();
        while (curr.kind != TokenKind::CloseBrace && curr.kind != TokenKind::EndOfFile) {
            auto attributes = parseAttributes();

            Token randomQualifier;
            switch (peek().kind) {
                case TokenKind::RandKeyword:
                case TokenKind::RandCKeyword:
                    randomQualifier = consume();
                    if (packed)
                        addDiag(diag::RandOnPackedMember, randomQualifier.range());
                    else if (keyword.kind == TokenKind::UnionKeyword)
                        addDiag(diag::RandOnUnionMember, randomQualifier.range());
                    break;
                default:
                    break;
            }

            bitmask<TypeOptions> typeOptions;
            if (tagged.valid() && keyword.kind == TokenKind::UnionKeyword)
                typeOptions = TypeOptions::AllowVoid;

            auto& type = parseDataType(typeOptions);

            Token semi;
            auto declarators = parseDeclarators(semi);

            buffer.push_back(
                &factory.structUnionMember(attributes, randomQualifier, type, declarators, semi));

            // If we failed to consume any tokens for this member, skip whatever token is
            // in the way, otherwise we will loop forever.
            if (type.kind == SyntaxKind::ImplicitType && declarators.empty() &&
                peek().location() == curr.location()) {
                skipToken({});
            }

            curr = peek();
        }
        closeBrace = expect(TokenKind::CloseBrace);

        if (buffer.empty() && !closeBrace.isMissing())
            addDiag(diag::ExpectedMember, closeBrace.location());
    }

    auto dims = parseDimensionList();
    if (!packed) {
        if (!dims.empty()) {
            SourceRange range{dims.front()->getFirstToken().location(),
                              dims.back()->getLastToken().range().end()};
            addDiag(diag::PackedDimsOnUnpacked, range);
        }

        if (signing)
            addDiag(diag::UnpackedSigned, signing.range());
    }

    if (keyword.kind == TokenKind::StructKeyword && tagged.valid())
        addDiag(diag::TaggedStruct, tagged.range());

    return factory.structUnionType(syntaxKind, keyword, tagged, packed, signing, openBrace,
                                   buffer.copy(alloc), closeBrace, dims);
}